

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escape.c
# Opt level: O1

CURLcode Curl_urldecode(Curl_easy *data,char *string,size_t length,char **ostring,size_t *olen,
                       _Bool reject_ctrl)

{
  byte bVar1;
  int iVar2;
  CURLcode CVar3;
  char *pcVar4;
  ulong ulnum;
  size_t sVar5;
  undefined3 in_register_00000089;
  size_t sVar6;
  byte bVar7;
  size_t sVar8;
  char hexstr [3];
  char *ptr;
  byte local_4f;
  byte local_4e;
  undefined1 local_4d;
  undefined4 local_4c;
  size_t *local_48;
  char **local_40;
  char *local_38;
  
  local_4c = CONCAT31(in_register_00000089,reject_ctrl);
  if (length == 0) {
    length = strlen(string);
  }
  pcVar4 = (char *)(*Curl_cmalloc)(length + 1);
  if (pcVar4 == (char *)0x0) {
    CVar3 = CURLE_OUT_OF_MEMORY;
  }
  else {
    sVar6 = 0;
    sVar5 = length + 1;
    local_48 = olen;
    local_40 = ostring;
    do {
      sVar8 = sVar5 - 1;
      if (sVar8 == 0) {
        pcVar4[sVar6] = '\0';
        if (local_48 != (size_t *)0x0) {
          *local_48 = sVar6;
        }
        *local_40 = pcVar4;
        return CURLE_OK;
      }
      bVar1 = *string;
      if ((((2 < sVar8) && (bVar1 == 0x25)) &&
          (iVar2 = Curl_isxdigit((uint)((byte *)string)[1]), iVar2 != 0)) &&
         (iVar2 = Curl_isxdigit((uint)((byte *)string)[2]), iVar2 != 0)) {
        local_4f = ((byte *)string)[1];
        local_4e = ((byte *)string)[2];
        local_4d = 0;
        ulnum = strtoul((char *)&local_4f,&local_38,0x10);
        bVar1 = curlx_ultouc(ulnum);
        sVar8 = sVar5 - 3;
        string = (char *)((byte *)string + 2);
      }
      bVar7 = bVar1 < 0x20 & (byte)local_4c;
      if (bVar7 == 1) {
        (*Curl_cfree)(pcVar4);
      }
      else {
        pcVar4[sVar6] = bVar1;
        sVar6 = sVar6 + 1;
        string = (char *)((byte *)string + 1);
      }
      sVar5 = sVar8;
    } while (bVar7 == 0);
    CVar3 = CURLE_URL_MALFORMAT;
  }
  return CVar3;
}

Assistant:

CURLcode Curl_urldecode(struct Curl_easy *data,
                        const char *string, size_t length,
                        char **ostring, size_t *olen,
                        bool reject_ctrl)
{
  size_t alloc = (length?length:strlen(string)) + 1;
  char *ns = malloc(alloc);
  size_t strindex = 0;
  unsigned long hex;
  CURLcode result = CURLE_OK;

  if(!ns)
    return CURLE_OUT_OF_MEMORY;

  while(--alloc > 0) {
    unsigned char in = *string;
    if(('%' == in) && (alloc > 2) &&
       ISXDIGIT(string[1]) && ISXDIGIT(string[2])) {
      /* this is two hexadecimal digits following a '%' */
      char hexstr[3];
      char *ptr;
      hexstr[0] = string[1];
      hexstr[1] = string[2];
      hexstr[2] = 0;

      hex = strtoul(hexstr, &ptr, 16);

      in = curlx_ultouc(hex); /* this long is never bigger than 255 anyway */

      if(data) {
        result = Curl_convert_from_network(data, (char *)&in, 1);
        if(result) {
          /* Curl_convert_from_network calls failf if unsuccessful */
          free(ns);
          return result;
        }
      }

      string += 2;
      alloc -= 2;
    }

    if(reject_ctrl && (in < 0x20)) {
      free(ns);
      return CURLE_URL_MALFORMAT;
    }

    ns[strindex++] = in;
    string++;
  }
  ns[strindex] = 0; /* terminate it */

  if(olen)
    /* store output size */
    *olen = strindex;

  /* store output string */
  *ostring = ns;

  return CURLE_OK;
}